

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  ostream *poVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  uint local_b0;
  allocator local_a9;
  uint index_1;
  Value *local_88;
  Value *childValue;
  uint index;
  bool hasChildValue;
  undefined1 local_55;
  bool isArrayMultiLine;
  allocator local_41;
  string local_40;
  UInt local_1c;
  Value *pVStack_18;
  uint size;
  Value *value_local;
  StyledStreamWriter *this_local;
  
  pVStack_18 = value;
  value_local = (Value *)this;
  local_1c = Value::size(value);
  if (local_1c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"[]",&local_41);
    pushValue(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    local_55 = isMultineArray(this,pVStack_18);
    if ((bool)local_55) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&index,"[",(allocator *)((long)&childValue + 7));
      writeWithIndent(this,(string *)&index);
      std::__cxx11::string::~string((string *)&index);
      std::allocator<char>::~allocator((allocator<char> *)((long)&childValue + 7));
      indent(this);
      bVar2 = beast::unit_test::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
      childValue._6_1_ = (bVar2 ^ 0xffU) & 1;
      childValue._0_4_ = 0;
      while( true ) {
        local_88 = Value::operator[](pVStack_18,(UInt)childValue);
        if ((childValue._6_1_ & 1) == 0) {
          writeIndent(this);
          writeValue(this,local_88);
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->childValues_,(ulong)(UInt)childValue);
          writeWithIndent(this,pvVar3);
        }
        childValue._0_4_ = (UInt)childValue + 1;
        if ((UInt)childValue == local_1c) break;
        std::operator<<(this->document_,",");
      }
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&index_1,"]",&local_a9);
      writeWithIndent(this,(string *)&index_1);
      std::__cxx11::string::~string((string *)&index_1);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    else {
      sVar4 = beast::unit_test::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
      if (sVar4 != local_1c) {
        __assert_fail("childValues_.size () == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_writer.cpp"
                      ,0x27b,"void Json::StyledStreamWriter::writeArrayValue(const Value &)");
      }
      std::operator<<(this->document_,"[ ");
      for (local_b0 = 0; local_b0 < local_1c; local_b0 = local_b0 + 1) {
        if (local_b0 != 0) {
          std::operator<<(this->document_,", ");
        }
        poVar1 = this->document_;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->childValues_,(ulong)local_b0);
        std::operator<<(poVar1,(string *)pvVar3);
      }
      std::operator<<(this->document_," ]");
    }
  }
  return;
}

Assistant:

void
StyledStreamWriter::writeArrayValue ( const Value& value )
{
    unsigned size = value.size ();

    if ( size == 0 )
        pushValue ( "[]" );
    else
    {
        bool isArrayMultiLine = isMultineArray ( value );

        if ( isArrayMultiLine )
        {
            writeWithIndent ( "[" );
            indent ();
            bool hasChildValue = !childValues_.empty ();
            unsigned index = 0;

            while ( true )
            {
                const Value& childValue = value[index];

                if ( hasChildValue )
                    writeWithIndent ( childValues_[index] );
                else
                {
                    writeIndent ();
                    writeValue ( childValue );
                }

                if ( ++index == size )
                    break;

                *document_ << ",";
            }

            unindent ();
            writeWithIndent ( "]" );
        }
        else // output on a single line
        {
            assert ( childValues_.size () == size );
            *document_ << "[ ";

            for ( unsigned index = 0; index < size; ++index )
            {
                if ( index > 0 )
                    *document_ << ", ";

                *document_ << childValues_[index];
            }

            *document_ << " ]";
        }
    }
}